

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pd~.c
# Opt level: O2

void pd_tilde_tick(t_pd_tilde *x)

{
  uint uVar1;
  t_atom *ptVar2;
  t_atom *ptVar3;
  long lVar4;
  ulong uVar5;
  ulong uVar6;
  
  uVar1 = binbuf_getnatom(x->x_binbuf);
  ptVar2 = binbuf_getvec(x->x_binbuf);
  uVar5 = 0;
  uVar6 = (ulong)uVar1;
  if ((int)uVar1 < 1) {
    uVar6 = uVar5;
  }
  uVar1 = 0;
  do {
    ptVar3 = ptVar2 + uVar5;
    while( true ) {
      if (uVar6 == uVar5) {
        binbuf_clear(x->x_binbuf);
        return;
      }
      if (ptVar3->a_type == A_SEMI) break;
      uVar5 = uVar5 + 1;
      ptVar3 = ptVar3 + 1;
    }
    lVar4 = (long)(int)uVar1;
    if (lVar4 < (long)uVar5) {
      if (ptVar2[lVar4].a_type == A_SYMBOL) {
        outlet_anything(x->x_outlet1,ptVar2[lVar4].a_w.w_symbol,~uVar1 + (int)uVar5,
                        ptVar2 + lVar4 + 1);
      }
      else {
        outlet_list(x->x_outlet1,(t_symbol *)0x0,(int)uVar5 - uVar1,ptVar2 + lVar4);
      }
    }
    uVar5 = uVar5 + 1;
    uVar1 = (uint)uVar5;
  } while( true );
}

Assistant:

static void pd_tilde_tick(t_pd_tilde *x)
{
    int messstart = 0, i, n;
    t_atom *vec;
    /* binbuf_print(b); */
    n = binbuf_getnatom(x->x_binbuf);
    vec = binbuf_getvec(x->x_binbuf);
    for (i = 0; i < n; i++)
    {
        if (vec[i].a_type == A_SEMI)
        {
            if (i > messstart && vec[messstart].a_type == A_SYMBOL)
                outlet_anything(x->x_outlet1, vec[messstart].a_w.w_symbol,
                    i-(messstart+1), vec+(messstart+1));
            else if (i > messstart)
                outlet_list(x->x_outlet1, 0, i-messstart, vec+messstart);
            messstart = i+1;
        }
    }
    binbuf_clear(x->x_binbuf);
}